

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O3

void google::protobuf::compiler::java::EscapeUtf16ToString(uint16_t code,string *output)

{
  int iVar1;
  undefined6 in_register_0000003a;
  string local_30;
  
  iVar1 = (int)CONCAT62(in_register_0000003a,code);
  if (iVar1 < 0x22) {
    switch(iVar1) {
    case 8:
      break;
    case 9:
      break;
    case 10:
      break;
    default:
switchD_0024ca0b_caseD_b:
      if ((ushort)(code - 0x20) < 0x60) {
        std::__cxx11::string::push_back((char)output);
        return;
      }
      StringPrintf_abi_cxx11_(&local_30,"\\u%04x");
      std::__cxx11::string::_M_append((char *)output,(ulong)local_30._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_30._M_dataplus._M_p != &local_30.field_2) {
        operator_delete(local_30._M_dataplus._M_p);
      }
      return;
    case 0xc:
      break;
    case 0xd:
    }
  }
  else if (((iVar1 != 0x22) && (iVar1 != 0x27)) && (iVar1 != 0x5c)) goto switchD_0024ca0b_caseD_b;
  std::__cxx11::string::append((char *)output);
  return;
}

Assistant:

void EscapeUtf16ToString(uint16_t code, std::string* output) {
  if (code == '\t') {
    output->append("\\t");
  } else if (code == '\b') {
    output->append("\\b");
  } else if (code == '\n') {
    output->append("\\n");
  } else if (code == '\r') {
    output->append("\\r");
  } else if (code == '\f') {
    output->append("\\f");
  } else if (code == '\'') {
    output->append("\\'");
  } else if (code == '\"') {
    output->append("\\\"");
  } else if (code == '\\') {
    output->append("\\\\");
  } else if (code >= 0x20 && code <= 0x7f) {
    output->push_back(static_cast<char>(code));
  } else {
    output->append(StringPrintf("\\u%04x", code));
  }
}